

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O3

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  int *piVar2;
  QDebug QVar3;
  bool bVar4;
  int iVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  undefined1 local_150 [24];
  undefined1 local_138 [24];
  QArrayData *local_120;
  undefined8 *local_118;
  QDebug local_108;
  undefined1 local_100 [8];
  QDebug local_f8;
  QModelIndex local_f0;
  undefined1 local_d8 [32];
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 local_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8._0_4_ = None;
  bVar4 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)local_d8,"changeInFlight",
                     "ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3b0);
  if (!bVar4) goto LAB_0014bd09;
  this->changeInFlight = RowsRemoved;
  lcModelTest();
  if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_d8._0_4_ = ColumnsMoved;
    local_d8._4_8_ = 0;
    local_d8._12_4_ = 0;
    local_d8._16_4_ = 0;
    local_d8._20_4_ = 0;
    local_d8._24_8_ = lcModelTest::category.name;
    QMessageLogger::debug();
    QVar3.stream = local_108.stream;
    QVar7.m_data = (storage_type *)0x14;
    QVar7.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QVar3.stream = local_108.stream;
    QVar8.m_data = (storage_type *)0x6;
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_108.stream,start);
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QVar3.stream = local_108.stream;
    QVar9.m_data = (storage_type *)0x4;
    QVar9.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_108.stream,end);
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QVar3.stream = local_108.stream;
    QVar10.m_data = (storage_type *)0x7;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    *(int *)((QTextStream *)local_108.stream + 0x28) =
         *(int *)((QTextStream *)local_108.stream + 0x28) + 1;
    operator<<((Stream *)(local_100 + 8),(QModelIndex *)local_100);
    QVar3.stream = local_f8.stream;
    QVar11.m_data = (storage_type *)0xc;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    pQVar6 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar6 + 0x90))(&local_58,pQVar6,parent,0);
    QVariant::toString();
    if (local_118 == (undefined8 *)0x0) {
      local_118 = &QString::_empty;
    }
    QDebug::putString((QChar *)(local_100 + 8),(ulong)local_118);
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    QVar3.stream = local_f8.stream;
    QVar12.m_data = (storage_type *)0x18;
    QVar12.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_78);
    piVar2 = (int *)CONCAT44(local_78._4_4_,local_78._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    pQVar6 = (this->model).wp.value;
    iVar5 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,parent);
    QTextStream::operator<<((QTextStream *)local_f8.stream,iVar5);
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    QVar3.stream = local_f8.stream;
    QVar13.m_data = (storage_type *)0x14;
    QVar13.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_78);
    piVar2 = (int *)CONCAT44(local_78._4_4_,local_78._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    *(int *)((QTextStream *)local_f8.stream + 0x28) =
         *(int *)((QTextStream *)local_f8.stream + 0x28) + 1;
    pQVar6 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar6 + 0x60))(local_138,pQVar6,start + -1,0,parent);
    operator<<((QDebug)&local_f0.i,(QModelIndex *)(local_100 + 0x10));
    iVar5 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
    pQVar6 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar6 + 0x60))(local_150,pQVar6,start + -1,0,parent);
    if (iVar5 == 0) {
      pQVar6 = (QObject *)0x0;
    }
    (**(code **)(*(long *)pQVar6 + 0x90))(&local_78,pQVar6,local_150,0);
    operator<<((QDebug *)&local_f0.m,(QVariant *)&local_f0.i);
    QDebug::~QDebug((QDebug *)&local_f0.m);
    QVariant::~QVariant((QVariant *)&local_78);
    QDebug::~QDebug((QDebug *)&local_f0.i);
    QDebug::~QDebug((QDebug *)(local_100 + 0x10));
    if (local_120 != (QArrayData *)0x0) {
      LOCK();
      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_120,2,0x10);
      }
    }
    QVariant::~QVariant((QVariant *)&local_58);
    QDebug::~QDebug((QDebug *)(local_100 + 8));
    QDebug::~QDebug((QDebug *)local_100);
    QDebug::~QDebug(&local_108);
  }
  local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.shared = (PrivateShared *)0x0;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  local_a0 = 2;
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  local_80 = 2;
  local_d8._0_4_ = parent->r;
  local_d8._4_8_ = *(undefined8 *)&parent->c;
  local_d8._12_4_ = *(undefined4 *)((long)&parent->i + 4);
  pQVar1 = (parent->m).ptr;
  local_d8._16_4_ = SUB84(pQVar1,0);
  local_d8._20_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
  pQVar6 = (this->model).wp.value;
  iVar5 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,parent);
  local_d8._24_4_ = iVar5;
  if (start < 1) {
LAB_0014bbd9:
    if (end < local_d8._24_4_ + -1) {
      pQVar6 = (this->model).wp.value;
      iVar5 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,parent);
      if (0 < iVar5) {
        local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_4_ = -0x55555556;
        local_78._4_4_ = -0x55555556;
        local_78._8_4_ = 0xaaaaaaaa;
        local_78._12_4_ = 0xaaaaaaaa;
        pQVar6 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar6 + 0x60))(&local_78,pQVar6,end + 1,0,parent);
        bVar4 = false;
        if ((-1 < (int)local_78._0_4_) && (bVar4 = false, -1 < (int)local_78._4_4_)) {
          bVar4 = (undefined1 *)local_78._16_8_ != (undefined1 *)0x0;
        }
        iVar5 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar4,(uchar *)"endIndex.isValid()",0x157a73,
                       (uchar *)
                       "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,0x3c3);
        if ((char)iVar5 == '\0') goto LAB_0014bcf9;
        pQVar6 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar6 + 0x90))(&local_58,pQVar6,&local_78,0);
        QVariant::operator=((QVariant *)&local_98,(QVariant *)&local_58);
        QVariant::~QVariant((QVariant *)&local_58);
      }
    }
    QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::
    emplace<QAbstractItemModelTesterPrivate::Changing_const&>
              ((QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *)&this->remove,
               (this->remove).super_QList<QAbstractItemModelTesterPrivate::Changing>.d.size,
               (Changing *)local_d8);
    QList<QAbstractItemModelTesterPrivate::Changing>::end
              (&(this->remove).super_QList<QAbstractItemModelTesterPrivate::Changing>);
  }
  else {
    pQVar6 = (this->model).wp.value;
    iVar5 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,parent);
    if (iVar5 < 1) goto LAB_0014bbd9;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_4_ = -0x55555556;
    local_78._4_4_ = -0x55555556;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    pQVar6 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar6 + 0x60))(&local_78,pQVar6,start + -1,0,parent);
    bVar4 = false;
    if ((-1 < (int)local_78._0_4_) && (bVar4 = false, -1 < (int)local_78._4_4_)) {
      bVar4 = (undefined1 *)local_78._16_8_ != (undefined1 *)0x0;
    }
    iVar5 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar4,(uchar *)"startIndex.isValid()",0x157a73,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3be);
    if ((char)iVar5 != '\0') {
      pQVar6 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar6 + 0x90))(&local_58,pQVar6,&local_78,0);
      QVariant::operator=((QVariant *)&local_b8,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_0014bbd9;
    }
  }
LAB_0014bcf9:
  QVariant::~QVariant((QVariant *)&local_98);
  QVariant::~QVariant((QVariant *)&local_b8);
LAB_0014bd09:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsRemoved;

    qCDebug(lcModelTest) << "rowsAboutToBeRemoved"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before removal=" << model->index(start - 1, 0, parent) << model->data(model->index(start - 1, 0, parent));

    Changing c;
    c.parent = parent;
    c.oldSize = model->rowCount(parent);
    if (start > 0 && model->columnCount(parent) > 0) {
        const QModelIndex startIndex = model->index(start - 1, 0, parent);
        MODELTESTER_VERIFY(startIndex.isValid());
        c.last = model->data(startIndex);
    }
    if (end < c.oldSize - 1 && model->columnCount(parent) > 0) {
        const QModelIndex endIndex = model->index(end + 1, 0, parent);
        MODELTESTER_VERIFY(endIndex.isValid());
        c.next = model->data(endIndex);
    }

    remove.push(c);
}